

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O2

xmlEntityPtr xmlSAX2GetEntity(void *ctx,xmlChar *name)

{
  xmlDoc *pxVar1;
  xmlEntityPtr pxVar2;
  xmlChar *in_R8;
  
  if (ctx == (void *)0x0) {
    pxVar2 = (xmlEntityPtr)0x0;
  }
  else if ((*(int *)((long)ctx + 0x150) != 0) ||
          (pxVar2 = xmlGetPredefinedEntity(name), pxVar2 == (xmlEntityPtr)0x0)) {
    pxVar1 = *(xmlDoc **)((long)ctx + 0x10);
    if ((pxVar1 == (xmlDoc *)0x0) || (pxVar1->standalone != 1)) {
      pxVar2 = xmlGetDocEntity(pxVar1,name);
      return pxVar2;
    }
    if (*(int *)((long)ctx + 0x150) == 2) {
      pxVar1->standalone = 0;
      pxVar2 = xmlGetDocEntity(pxVar1,name);
      *(undefined4 *)(*(long *)((long)ctx + 0x10) + 0x4c) = 1;
    }
    else {
      pxVar2 = xmlGetDocEntity(pxVar1,name);
      if (pxVar2 == (xmlEntityPtr)0x0) {
        pxVar1 = *(xmlDoc **)((long)ctx + 0x10);
        pxVar1->standalone = 0;
        pxVar2 = xmlGetDocEntity(pxVar1,name);
        if (pxVar2 != (xmlEntityPtr)0x0) {
          xmlFatalErrMsg((xmlParserCtxtPtr)ctx,XML_ERR_NOT_STANDALONE,
                         "Entity(%s) document marked standalone but requires external subset\n",name
                         ,in_R8);
        }
        *(undefined4 *)(*(long *)((long)ctx + 0x10) + 0x4c) = 1;
      }
    }
  }
  return pxVar2;
}

Assistant:

xmlEntityPtr
xmlSAX2GetEntity(void *ctx, const xmlChar *name)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlEntityPtr ret = NULL;

    if (ctx == NULL) return(NULL);

    if (ctxt->inSubset == 0) {
	ret = xmlGetPredefinedEntity(name);
	if (ret != NULL)
	    return(ret);
    }
    if ((ctxt->myDoc != NULL) && (ctxt->myDoc->standalone == 1)) {
	if (ctxt->inSubset == 2) {
	    ctxt->myDoc->standalone = 0;
	    ret = xmlGetDocEntity(ctxt->myDoc, name);
	    ctxt->myDoc->standalone = 1;
	} else {
	    ret = xmlGetDocEntity(ctxt->myDoc, name);
	    if (ret == NULL) {
		ctxt->myDoc->standalone = 0;
		ret = xmlGetDocEntity(ctxt->myDoc, name);
		if (ret != NULL) {
		    xmlFatalErrMsg(ctxt, XML_ERR_NOT_STANDALONE,
	 "Entity(%s) document marked standalone but requires external subset\n",
				   name, NULL);
		}
		ctxt->myDoc->standalone = 1;
	    }
	}
    } else {
	ret = xmlGetDocEntity(ctxt->myDoc, name);
    }
    return(ret);
}